

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CArgumentList *stm)

{
  ulong uVar1;
  size_type sVar2;
  reference this_00;
  CError local_80;
  TypeInfo local_50;
  pointer local_28;
  pointer argument;
  int index;
  bool areAllArgsBuilt;
  CArgumentList *stm_local;
  CTypeCheckerVisitor *this_local;
  
  _index = stm;
  stm_local = (CArgumentList *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: arglist\n");
  argument._7_1_ = 1;
  argument._0_4_ = 0;
  do {
    uVar1 = (ulong)(int)argument;
    sVar2 = std::
            vector<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>,_std::allocator<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>_>_>
            ::size(&_index->arguments);
    if (sVar2 <= uVar1) {
LAB_00143608:
      if ((argument._7_1_ & 1) == 0) {
        CError::CError(&local_80,(string *)CError::AST_ERROR_abi_cxx11_,
                       &(_index->super_IWrapper).super_PositionedNode.position);
        std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_80);
        CError::~CError(&local_80);
      }
      else {
        TypeInfo::TypeInfo(&local_50,VOID);
        TypeInfo::operator=(&this->lastCalculatedType,&local_50);
        TypeInfo::~TypeInfo(&local_50);
      }
      return;
    }
    this_00 = std::
              vector<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>,_std::allocator<std::unique_ptr<CArgument,_std::default_delete<CArgument>_>_>_>
              ::operator[](&_index->arguments,(long)(int)argument);
    local_28 = std::unique_ptr<CArgument,_std::default_delete<CArgument>_>::get(this_00);
    if (local_28 == (pointer)0x0) {
      argument._7_1_ = 0;
      goto LAB_00143608;
    }
    (**(local_28->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(local_28,this);
    argument._0_4_ = (int)argument + 1;
  } while( true );
}

Assistant:

void CTypeCheckerVisitor::Visit( CArgumentList &stm ) 
{
	std::cout << "typechecker: arglist\n";
    bool areAllArgsBuilt = true;
    for (int index = 0; index < stm.arguments.size(); ++index) {
        auto argument = stm.arguments[index].get();
        if( !argument ) {
            areAllArgsBuilt = false;
            break;
        }
        argument->Accept( *this );
    }
    if( areAllArgsBuilt ) {
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}